

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O3

void __thiscall InfoListWnd::~InfoListWnd(InfoListWnd *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  (this->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow =
       (_func_int **)&PTR__InfoListWnd_002daed0;
  gIlwState.activeTab = this->activeTab;
  gIlwState.bFilterAcOnly = (this->acList).bFilterAcOnly;
  strncpy(gIlwState.sAcFilter,this->sAcFilter,0x32);
  gIlwState.msgLvlFilter = this->msgLvlFilter;
  strncpy(gIlwState.sMsgFilter,this->sMsgFilter,0x32);
  gpILW = (InfoListWnd *)0x0;
  pcVar2 = (this->weatherMETAR)._M_dataplus._M_p;
  paVar1 = &(this->weatherMETAR).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->weatherStationId)._M_dataplus._M_p;
  paVar1 = &(this->weatherStationId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->aiCtrlPlugin)._M_dataplus._M_p;
  paVar1 = &(this->aiCtrlPlugin).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->verText)._M_dataplus._M_p;
  paVar1 = &(this->verText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->msgIterList).
           super__List_base<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->msgIterList) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var3;
  }
  pcVar2 = (this->acList).filterInUse._M_dataplus._M_p;
  paVar1 = &(this->acList).filterInUse.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<FDInfo,_std::allocator<FDInfo>_>::~vector(&(this->acList).vecFDI);
  pcVar2 = (this->wndTitle)._M_dataplus._M_p;
  paVar1 = &(this->wndTitle).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  LTImgWindow::~LTImgWindow(&this->super_LTImgWindow);
  return;
}

Assistant:

InfoListWnd::~InfoListWnd()
{
    // save state
    gIlwState.activeTab = activeTab;
    gIlwState.bFilterAcOnly = acList.bFilterAcOnly;
    strncpy(gIlwState.sAcFilter, sAcFilter, sizeof(gIlwState.sAcFilter));
    gIlwState.msgLvlFilter = msgLvlFilter;
    strncpy(gIlwState.sMsgFilter, sMsgFilter, sizeof(gIlwState.sMsgFilter));

    // I am no longer
    gpILW = nullptr;
}